

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BamHttp_p.cpp
# Opt level: O2

void __thiscall BamTools::Internal::BamHttp::~BamHttp(BamHttp *this)

{
  TcpSocket *this_00;
  
  (this->super_IBamIODevice)._vptr_IBamIODevice = (_func_int **)&PTR__BamHttp_001fdae0;
  Close(this);
  this_00 = this->m_socket;
  if (this_00 != (TcpSocket *)0x0) {
    TcpSocket::~TcpSocket(this_00);
    operator_delete(this_00);
  }
  std::__cxx11::string::~string((string *)&this->m_filename);
  std::__cxx11::string::~string((string *)&this->m_port);
  std::__cxx11::string::~string((string *)&this->m_hostname);
  IBamIODevice::~IBamIODevice(&this->super_IBamIODevice);
  return;
}

Assistant:

BamHttp::~BamHttp()
{

    // close connection & clean up
    Close();
    if (m_socket) delete m_socket;
}